

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::broadcast_priority_change(raft_server *this,int srv_id,int new_priority)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int32 iVar4;
  element_type *this_00;
  iterator myself;
  iterator req_00;
  element_type *peVar5;
  long lVar6;
  element_type *this_01;
  element_type *peVar7;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  ptr<peer> pp;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *v;
  ptr<log_entry> le;
  ptr<buffer> buf;
  ptr<req_msg> req;
  peer_itor it;
  srv_config *s_conf;
  shared_ptr<nuraft::srv_config> *entry;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *__range1;
  ptr<cluster_config> cur_config;
  memory_order __b;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffde8;
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
  *in_stack_fffffffffffffdf0;
  peer *this_02;
  element_type *in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  raft_server *in_stack_fffffffffffffe08;
  element_type *in_stack_fffffffffffffe10;
  unsigned_long *in_stack_fffffffffffffe18;
  buffer *in_stack_fffffffffffffe20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe30;
  id in_stack_fffffffffffffe38;
  string local_150 [32];
  unsigned_long local_130 [2];
  undefined1 local_120 [32];
  thread in_stack_ffffffffffffff00;
  raft_server *in_stack_ffffffffffffff08;
  undefined1 local_e0 [24];
  undefined4 uVar8;
  undefined8 local_a8;
  undefined8 local_a0;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_98;
  string local_90 [32];
  __atomic_base<unsigned_long> local_70;
  __atomic_base<long> in_stack_ffffffffffffff98;
  peer *in_stack_ffffffffffffffb0;
  
  if (in_ESI == *(uint *)(in_RDI + 0x38)) {
    *(uint *)(in_RDI + 0x3c) = in_EDX;
  }
  get_config(in_stack_fffffffffffffe08);
  this_00 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a9425);
  cluster_config::get_servers_abi_cxx11_(this_00);
  myself = std::__cxx11::
           list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
           ::begin((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                    *)in_stack_fffffffffffffde8);
  req_00 = std::__cxx11::
           list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
           ::end((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  *)in_stack_fffffffffffffde8);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa8,(_Self *)&stack0xffffffffffffffa0
                                ), bVar1) {
    in_stack_ffffffffffffff98._M_i =
         (__int_type_conflict2)
         std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                   ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)0x1a949c);
    local_70._M_i =
         (__int_type)
         std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffff98._M_i);
    uVar2 = srv_config::get_id((srv_config *)local_70._M_i);
    if (uVar2 == in_ESI) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a9514);
        iVar3 = (**(code **)(*(long *)peVar7 + 0x38))();
        if (3 < iVar3) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a954d);
          uVar2 = srv_config::get_priority((srv_config *)local_70._M_i);
          msg_if_given_abi_cxx11_
                    ((char *)local_90,"Change server %d priority %d -> %d",(ulong)in_ESI,
                     (ulong)uVar2,(ulong)in_EDX);
          (**(code **)(*(long *)peVar7 + 0x40))
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"broadcast_priority_change",0x71,local_90);
          std::__cxx11::string::~string(local_90);
        }
      }
      srv_config::set_priority((srv_config *)local_70._M_i,in_EDX);
    }
    std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++
              ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)&stack0xffffffffffffffa8);
  }
  local_a0 = std::
             unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
             ::begin(in_stack_fffffffffffffde8);
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            (in_stack_fffffffffffffdf0,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             in_stack_fffffffffffffde8);
  while( true ) {
    local_a8 = std::
               unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               ::end(in_stack_fffffffffffffde8);
    bVar1 = std::__detail::operator!=
                      (&local_98,
                       (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        *)&stack0xffffffffffffff58);
    if (!bVar1) break;
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a96d4);
    srv_state::get_term((srv_state *)0x1a96dc);
    uVar8 = 0x18;
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)0x1a9722);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a972e);
    iVar4 = peer::get_id((peer *)0x1a9736);
    peVar5 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a9761);
    (**(code **)(*(long *)peVar5 + 0x10))();
    local_e0._16_8_ =
         term_for_log(in_stack_ffffffffffffff08,(ulong)in_stack_ffffffffffffff00._M_id._M_thread);
    peVar5 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a97b1);
    lVar6 = (**(code **)(*(long *)peVar5 + 0x10))();
    local_e0._8_8_ = lVar6 + -1;
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    local_e0._0_8_ = *(undefined8 *)(in_RDI + 0xa0);
    this_02 = (peer *)local_e0;
    in_stack_fffffffffffffde8 =
         (unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
          *)(local_e0 + 8);
    cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
              (in_stack_fffffffffffffe18,(msg_type *)in_stack_fffffffffffffe10,
               (int *)in_stack_fffffffffffffe08,
               (int *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (unsigned_long *)in_stack_fffffffffffffdf8,(unsigned_long *)in_stack_fffffffffffffe30
               ,(unsigned_long *)in_stack_fffffffffffffe38._M_thread);
    buffer::alloc(CONCAT44(uVar8,iVar4));
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a98ef);
    buffer::pos((buffer *)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a990a);
    buffer::put(in_stack_fffffffffffffe20,(int32)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a9928);
    buffer::put(in_stack_fffffffffffffe20,(int32)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a9946);
    buffer::pos((buffer *)in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a9968);
    in_stack_fffffffffffffe38._M_thread = srv_state::get_term((srv_state *)0x1a9970);
    local_120._24_8_ = in_stack_fffffffffffffe38._M_thread;
    cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&>
              ((unsigned_long *)in_stack_fffffffffffffdf8,(shared_ptr<nuraft::buffer> *)this_02);
    this_01 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1a99b0);
    in_stack_fffffffffffffe30 =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)req_msg::log_entries(this_01);
    local_120._16_8_ = in_stack_fffffffffffffe30;
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                (value_type *)in_stack_fffffffffffffdf8);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)0x1a99f0);
    in_stack_fffffffffffffe20 = (buffer *)local_120;
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)this_02,
               (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffde8);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a9a13);
    bVar1 = peer::make_busy(this_02);
    if (bVar1) {
      in_stack_fffffffffffffe08 = (raft_server *)local_120;
      in_stack_fffffffffffffe10 =
           std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x1a9a40);
      in_stack_fffffffffffffe18 = local_130;
      std::shared_ptr<nuraft::peer>::shared_ptr
                ((shared_ptr<nuraft::peer> *)this_02,
                 (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffde8);
      peer::send_req(in_stack_ffffffffffffffb0,(ptr<peer> *)myself._M_node,
                     (ptr<req_msg> *)req_00._M_node,(rpc_handler *)in_stack_ffffffffffffff98._M_i);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1a9a91);
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a9b51);
        in_stack_fffffffffffffe04 = (**(code **)(*(long *)peVar7 + 0x38))();
        if (1 < in_stack_fffffffffffffe04) {
          in_stack_fffffffffffffdf8 =
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a9b84);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1a9b96);
          in_stack_fffffffffffffe00 = peer::get_id((peer *)0x1a9b9e);
          msg_if_given_abi_cxx11_
                    ((char *)local_150,"peer %d is currently busy, cannot send request",
                     (ulong)in_stack_fffffffffffffe00);
          (**(code **)(*(long *)in_stack_fffffffffffffdf8 + 0x40))
                    (in_stack_fffffffffffffdf8,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"broadcast_priority_change",0x92,local_150);
          std::__cxx11::string::~string(local_150);
        }
      }
    }
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1a9c32);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1a9c3f);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1a9c4c);
    std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1a9c59);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)this_02);
  }
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x1a9cae);
  return;
}

Assistant:

void raft_server::broadcast_priority_change(const int srv_id,
                                            const int new_priority)
{
    if (srv_id == id_) {
        my_priority_ = new_priority;
    }
    ptr<cluster_config> cur_config = get_config();
    for (auto& entry: cur_config->get_servers()) {
        srv_config* s_conf = entry.get();
        if (s_conf->get_id() == srv_id) {
            p_in("Change server %d priority %d -> %d",
                 srv_id, s_conf->get_priority(), new_priority);
            s_conf->set_priority(new_priority);
        }
    }

    // If there is no live leader now,
    // broadcast this request to all peers.
    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<req_msg> req( cs_new<req_msg>
                          ( state_->get_term(),
                            msg_type::priority_change_request,
                            id_,
                            it->second->get_id(),
                            term_for_log(log_store_->next_slot() - 1),
                            log_store_->next_slot() - 1,
                            quick_commit_index_.load() ) );

        // ID + priority
        ptr<buffer> buf = buffer::alloc(sz_int * 2);
        buf->pos(0);
        buf->put((int32)srv_id);
        buf->put((int32)new_priority);
        buf->pos(0);
        ptr<log_entry> le = cs_new<log_entry>(state_->get_term(), buf);

        std::vector< ptr<log_entry> >& v = req->log_entries();
        v.push_back(le);

        ptr<peer> pp = it->second;
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_er("peer %d is currently busy, cannot send request",
                 pp->get_id());
        }
    }
}